

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

Status __thiscall
leveldb::TableCache::Get
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,Slice *k,
          void *arg,_func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  Rep *pRVar1;
  undefined8 uVar2;
  long lVar3;
  Table local_38;
  undefined8 local_30;
  
  local_30 = 0;
  FindTable(this,(uint64_t)options,file_size,(Handle **)k);
  uVar2 = local_30;
  if (this->env_ == (Env *)0x0) {
    lVar3 = (**(code **)(**(long **)(options + 3) + 0x28))(*(long **)(options + 3),local_30);
    Table::InternalGet(&local_38,*(ReadOptions **)(lVar3 + 8),(Slice *)file_number,arg,handle_result
                      );
    pRVar1 = (Rep *)this->env_;
    this->env_ = (Env *)local_38.rep_;
    local_38.rep_ = pRVar1;
    Status::~Status((Status *)&local_38);
    (**(code **)(**(long **)(options + 3) + 0x20))(*(long **)(options + 3),uVar2);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableCache::Get(const ReadOptions& options, uint64_t file_number,
                       uint64_t file_size, const Slice& k, void* arg,
                       void (*handle_result)(void*, const Slice&,
                                             const Slice&)) {
  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (s.ok()) {
    Table* t = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
    s = t->InternalGet(options, k, arg, handle_result);
    cache_->Release(handle);
  }
  return s;
}